

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  _Var1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> __ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  char *__s;
  pointer pbVar6;
  int iVar7;
  cmValue value;
  cmPropertyMap *pcVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar10;
  string *psVar11;
  ostream *poVar12;
  size_t sVar13;
  pointer ppcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_370;
  cmGeneratorTarget *local_368;
  string *local_360;
  undefined1 local_358 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined1 *local_330;
  long local_328;
  undefined1 local_320;
  undefined7 uStack_31f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  string local_2d0;
  cmCompiledGeneratorExpression *local_2b0;
  cmLocalGenerator *local_2a8;
  undefined1 local_2a0 [24];
  pointer local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_258;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_250;
  cmLocalGenerator *local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [17];
  undefined7 uStack_21f;
  undefined8 uStack_218;
  ios_base local_1c0 [264];
  char *local_b8;
  pointer local_b0;
  pointer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_368 = tgt;
  local_b8 = defaultValue;
  value = cmGeneratorTarget::GetProperty(tgt,p);
  valueAsString<cmValue>(__return_storage_ptr__,value);
  pcVar8 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_88,pcVar8);
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  pcVar3 = local_368;
  bVar15 = _Var9._M_current !=
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(local_368->LinkImplicitNullProperties)._M_t,p);
  local_2f0 = &(pcVar3->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2e0 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2d8 = _Var9._M_current;
  if ((_Var9._M_current !=
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (local_2e8 != local_2f0)) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar10 = cmGeneratorTarget::GetLinkImplementationClosure(local_368,config);
  if ((pvVar10->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar10->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar11 = cmTarget::GetName_abi_cxx11_(local_368->Target);
    uStack_218 = (psVar11->_M_dataplus)._M_p;
    unique0x00012000 = psVar11->_M_string_length;
    local_230._0_8_ =
         (__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          )0xb;
    local_230._8_8_ = " * Target \"";
    views._M_len = 2;
    views._M_array = (iterator)local_230;
    cmCatViews_abi_cxx11_(&local_2d0,views);
    if (local_2d8 != local_2e0) {
      std::__cxx11::string::append((char *)&local_2d0);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_250._M_head_impl = (cmCompiledGeneratorExpression *)local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
      if (local_250._M_head_impl == (cmCompiledGeneratorExpression *)local_240) {
        uStack_218 = local_240._8_8_;
        local_250._M_head_impl = (cmCompiledGeneratorExpression *)(local_230 + 0x10);
      }
      uStack_21f = local_240._1_7_;
      local_230[0x10] = local_240[0];
      local_230._8_8_ = local_248;
      local_248 = (cmLocalGenerator *)0x0;
      local_240[0] = 0;
      local_230._0_8_ = local_250._M_head_impl;
      local_250._M_head_impl = (cmCompiledGeneratorExpression *)local_240;
      std::__cxx11::string::_M_append((char *)&local_2d0,local_230._0_8_);
      if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
        operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
      }
      if (local_250._M_head_impl != (cmCompiledGeneratorExpression *)local_240) {
        operator_delete(local_250._M_head_impl,CONCAT71(local_240._1_7_,local_240[0]) + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_2d0);
    std::operator+(&local_50,"INTERFACE_",p);
    local_370._M_head_impl = (cmCompiledGeneratorExpression *)0x0;
    iVar7 = std::__cxx11::string::compare((char *)p);
    if (iVar7 == 0) {
      local_358._0_8_ = local_368->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                 (cmGeneratorTarget **)config);
      uVar5 = local_230._0_8_;
      __ptr._M_head_impl = local_370._M_head_impl;
      local_370._M_head_impl = (cmCompiledGeneratorExpression *)local_230._0_8_;
      local_230._0_8_ = (cmCompiledGeneratorExpression *)0x0;
      if ((__ptr._M_head_impl != (cmCompiledGeneratorExpression *)0x0) &&
         (std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                    ((default_delete<cmGeneratorExpressionInterpreter> *)&local_370,
                     (cmGeneratorExpressionInterpreter *)__ptr._M_head_impl),
         (cmCompiledGeneratorExpression *)local_230._0_8_ != (cmCompiledGeneratorExpression *)0x0))
      {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_230,
                   (cmGeneratorExpressionInterpreter *)local_230._0_8_);
      }
    }
    ppcVar14 = (pvVar10->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (pvVar10->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_360 = p;
    if (ppcVar14 != local_b0) {
      bVar16 = local_2e8 != local_2f0;
      bVar17 = local_2d8 == local_2e0;
      do {
        pcVar3 = *ppcVar14;
        local_a8 = ppcVar14;
        pcVar8 = cmTarget::GetProperties(pcVar3->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_a0,pcVar8);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar6 = local_a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>
                  ((string *)(local_2a0 + 0x10),pcVar3,&local_50,
                   (cmGeneratorExpressionInterpreter *)local_370._M_head_impl);
        pbVar4 = local_2d8;
        local_330 = &local_320;
        local_328 = 0;
        local_320 = 0;
        if (_Var9._M_current == pbVar6) {
          iVar7 = 3;
          if (bVar17 && bVar16) {
LAB_003fe8b7:
            local_70[0] = local_60;
            pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
            local_230._8_8_ = (cmLocalGenerator *)0x0;
            stack0xfffffffffffffde0 = stack0xfffffffffffffde0 & 0xffffffffffffff00;
            local_230._0_8_ = (cmCompiledGeneratorExpression *)(local_230 + 0x10);
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_230);
            if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
                (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
              operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            if (_Var9._M_current != pbVar6) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_358,__return_storage_ptr__,(string *)(local_2a0 + 0x10),t)
              ;
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
              __s = local_b8;
              sVar13 = __return_storage_ptr__->_M_string_length;
              bVar18 = true;
              if (sVar13 == local_358._16_8_) {
                if (sVar13 == 0) {
                  bVar18 = false;
                }
                else {
                  iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                               sVar13);
                  bVar18 = iVar7 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_230,t,bVar18);
              std::__cxx11::string::_M_append((char *)&local_2d0,local_230._0_8_);
              if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
                  (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
                operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
              }
              if (local_358[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"Property ",9);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_230,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
                psVar11 = cmTarget::GetName_abi_cxx11_(local_368->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is\nimplied to be ",0x13);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," property on\ndependency \"",0x19);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_310);
                goto LAB_003fee14;
              }
              iVar7 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_003fee58;
            }
            iVar7 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_330);
          psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
          std::__cxx11::string::_M_append((char *)&local_330,(ulong)(psVar11->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_330);
          local_2b0 = (cmCompiledGeneratorExpression *)local_2a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,local_2a0._16_8_,
                     (char *)(local_2a0._16_8_ + (long)&local_288->_M_t));
          if (local_2b0 == (cmCompiledGeneratorExpression *)local_2a0) {
            uStack_218 = local_2a0._8_8_;
            local_2b0 = (cmCompiledGeneratorExpression *)(local_230 + 0x10);
          }
          uStack_21f = local_2a0._1_7_;
          local_230[0x10] = local_2a0[0];
          local_230._8_8_ = local_2a8;
          local_2a8 = (cmLocalGenerator *)0x0;
          local_2a0[0] = 0;
          local_230._0_8_ = local_2b0;
          local_2b0 = (cmCompiledGeneratorExpression *)local_2a0;
          std::__cxx11::string::_M_append((char *)&local_330,local_230._0_8_);
          if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
              (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
          }
          if (local_2b0 != (cmCompiledGeneratorExpression *)local_2a0) {
            operator_delete(local_2b0,CONCAT71(local_2a0._1_7_,local_2a0[0]) + 1);
          }
          std::__cxx11::string::append((char *)&local_330);
          if (pbVar4 == local_2e0) {
            if (local_2e8 != local_2f0) goto LAB_003fe8b7;
            if (bVar15) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_358,__return_storage_ptr__,(string *)(local_2a0 + 0x10),t)
              ;
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
              sVar13 = __return_storage_ptr__->_M_string_length;
              bVar15 = true;
              if (sVar13 == local_358._16_8_) {
                if (sVar13 == 0) {
                  bVar15 = false;
                }
                else {
                  iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                               sVar13);
                  bVar15 = iVar7 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_230,t,bVar15);
              std::__cxx11::string::_M_append((char *)&local_2d0,local_230._0_8_);
              if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
                  (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
                operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
              }
              if (local_358[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"The INTERFACE_",0xe);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_230,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," property of \"",0xe);
                psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" does\nnot agree with the value of ",0x23);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(local_360->_M_dataplus)._M_p,
                                     local_360->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," already determined\nfor \"",0x19);
                psVar11 = cmTarget::GetName_abi_cxx11_(local_368->Target);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_allocated_capacity != &local_300) {
                  operator_delete((void *)local_310._M_allocated_capacity,
                                  local_300._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
                std::ios_base::~ios_base(local_1c0);
                iVar7 = 2;
              }
              else {
                iVar7 = 3;
                std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._8_8_ != &local_340) {
                operator_delete((void *)local_358._8_8_,local_340._0_8_ + 1);
              }
              bVar15 = true;
            }
            else {
              local_230._0_8_ = (long)local_230 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_230,local_330,local_330 + local_328);
              std::__cxx11::string::append((char *)local_230);
              std::__cxx11::string::_M_append((char *)&local_2d0,local_230._0_8_);
              if (local_230._0_8_ != (long)local_230 + 0x10) {
                operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
              }
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              bVar15 = true;
              iVar7 = 0;
            }
          }
          else {
            consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_358,__return_storage_ptr__,(string *)(local_2a0 + 0x10),t);
            std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_330);
            sVar13 = __return_storage_ptr__->_M_string_length;
            bVar18 = true;
            if (sVar13 == local_358._16_8_) {
              if (sVar13 == 0) {
                bVar18 = false;
              }
              else {
                iVar7 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_358._8_8_,
                             sVar13);
                bVar18 = iVar7 != 0;
              }
            }
            compatibilityAgree_abi_cxx11_((string *)local_230,t,bVar18);
            std::__cxx11::string::_M_append((char *)&local_2d0,local_230._0_8_);
            if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
                (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
              operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
            }
            if (local_358[0] == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"Property ",9)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_230,(local_360->_M_dataplus)._M_p,
                                   local_360->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
              psVar11 = cmTarget::GetName_abi_cxx11_(local_368->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" does\nnot match the INTERFACE_",0x1f);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(local_360->_M_dataplus)._M_p,local_360->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," property requirement\nof dependency \"",0x25);
              psVar11 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((string *)&local_310);
LAB_003fee14:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_allocated_capacity != &local_300) {
                operator_delete((void *)local_310._M_allocated_capacity,
                                local_300._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
              std::ios_base::~ios_base(local_1c0);
              iVar7 = 2;
            }
            else {
              iVar7 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
LAB_003fee58:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._8_8_ != &local_340) {
              operator_delete((void *)local_358._8_8_,local_340._0_8_ + 1);
            }
          }
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,CONCAT71(uStack_31f,local_320) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._16_8_ != &local_280) {
          operator_delete((void *)local_2a0._16_8_,(ulong)(local_280._M_allocated_capacity + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
      } while (((iVar7 == 3) || (iVar7 == 0)) && (ppcVar14 = local_a8 + 1, ppcVar14 != local_b0));
    }
    pcVar3 = local_368;
    _Var1._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )((long)local_268._M_local_buf + 8);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_270._M_head_impl =
         (cmCompiledGeneratorExpression *)
         _Var1._M_t.
         super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
         .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    psVar11 = local_360;
    if ((tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
        )local_270._M_head_impl ==
        (_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
         )_Var1._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl) {
      uStack_218 = p_Stack_258;
      local_230._0_8_ = (cmCompiledGeneratorExpression *)(local_230 + 0x10);
    }
    else {
      local_230._0_8_ = local_270._M_head_impl;
    }
    uStack_21f = local_268._9_7_;
    local_230[0x10] = local_268._M_local_buf[8];
    local_230._8_8_ = local_268._M_allocated_capacity;
    local_268._M_allocated_capacity = 0;
    local_268._M_local_buf[8] = '\0';
    local_270._M_head_impl =
         (cmCompiledGeneratorExpression *)
         _Var1._M_t.
         super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
         .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    compatibilityType_abi_cxx11_((string *)local_358,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar3,psVar11,(string *)local_230,&local_2d0,(string *)local_358);
    if ((cmLocalGenerator *)local_358._0_8_ != (cmLocalGenerator *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if ((cmCompiledGeneratorExpression *)local_230._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_230 + 0x10)) {
      operator_delete((void *)local_230._0_8_,(ulong)(stack0xfffffffffffffde0 + 1));
    }
    if ((tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
        )local_270._M_head_impl !=
        (_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
         )_Var1._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl) {
      operator_delete(local_270._M_head_impl,CONCAT71(local_268._9_7_,local_268._M_local_buf[8]) + 1
                     );
    }
    if (local_370._M_head_impl != (cmCompiledGeneratorExpression *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_370,
                 (cmGeneratorExpressionInterpreter *)local_370._M_head_impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}